

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::WatWriter::PushExpr
          (WatWriter *this,Expr *expr,Index operand_count,Index result_count)

{
  undefined8 *puVar1;
  ulong uVar2;
  Expr *__result;
  pointer pEVar3;
  pointer pEVar4;
  ulong uVar5;
  pointer pEVar6;
  _Tp_alloc_type *p_Var7;
  undefined4 in_register_00000014;
  ExprTree *__args;
  ExprTree *extraout_RDX;
  ExprTree *extraout_RDX_00;
  ExprTree *extraout_RDX_01;
  ExprTree *__args_00;
  long lVar8;
  pointer pEVar9;
  Expr *pEVar10;
  long lVar11;
  pointer *ppEVar12;
  _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *p_Var13;
  Index IVar14;
  pointer pEVar15;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_a8;
  Expr *local_88;
  _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  *local_80;
  pointer local_78;
  long local_70;
  undefined1 local_68 [8];
  ExprTree tree;
  
  __args = (ExprTree *)CONCAT44(in_register_00000014,operand_count);
  uVar5 = (ulong)operand_count;
  pEVar6 = (this->expr_tree_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar4 = (this->expr_tree_stack_).
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)pEVar4 - (long)pEVar6;
  uVar2 = lVar11 >> 5;
  tree.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = result_count;
  if (uVar2 < uVar5) {
    if (pEVar4 == (this->expr_tree_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      p_Var7 = (_Tp_alloc_type *)0x7fffffffffffffe0;
      if (lVar11 == 0x7fffffffffffffe0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar5 = 1;
      if (pEVar4 != pEVar6) {
        uVar5 = uVar2;
      }
      pEVar3 = std::
               _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                              *)(uVar5 + uVar2),(size_t)expr);
      *(Expr **)((long)pEVar3 + lVar11) = expr;
      puVar1 = (undefined8 *)((long)pEVar3 + lVar11 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)pEVar3 + lVar11 + 0x18) = 0;
      pEVar4 = std::
               vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ::_S_relocate(pEVar6,pEVar4,pEVar3,p_Var7);
      if (pEVar6 != (pointer)0x0) {
        operator_delete(pEVar6);
      }
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = pEVar3;
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = pEVar4 + 1;
      (this->expr_tree_stack_).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar3 + (long)(uVar5 + uVar2);
    }
    else {
      pEVar4->expr = expr;
      (pEVar4->children).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pEVar4->children).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pEVar4->children).
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppEVar12 = &(this->expr_tree_stack_).
                  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *ppEVar12 = *ppEVar12 + 1;
    }
    FlushExprTreeStack(this);
    return;
  }
  tree.expr = (Expr *)0x0;
  tree.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tree.children.
  super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pEVar6 = pEVar4;
  local_68 = (undefined1  [8])expr;
  if (operand_count != 0) {
    local_70 = uVar5 * 0x20;
    local_78 = pEVar4 + -uVar5;
    lVar11 = uVar5 + 1;
    ppEVar12 = &(local_78->children).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    pEVar10 = expr;
    tree.children.
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = operand_count;
    do {
      expr = (Expr *)tree.children.
                     super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      if (tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        lVar8 = (long)tree.children.
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)tree.expr;
        if (lVar8 == 0x7fffffffffffffe0) goto LAB_00f680ed;
        uVar5 = lVar8 >> 5;
        local_88 = tree.expr;
        uVar2 = 1;
        if ((Expr *)tree.children.
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start != tree.expr) {
          uVar2 = uVar5;
        }
        p_Var13 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                   *)(uVar2 + uVar5);
        if ((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             *)0x3fffffffffffffe < p_Var13) {
          p_Var13 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                     *)0x3ffffffffffffff;
        }
        p_Var7 = (_Tp_alloc_type *)(uVar2 + uVar5);
        local_80 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    *)0x3ffffffffffffff;
        if (!CARRY8(uVar2,uVar5)) {
          local_80 = p_Var13;
        }
        __result = (Expr *)std::
                           _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                           ::_M_allocate(local_80,(size_t)local_80);
        pEVar10 = local_88;
        pEVar3 = ((_Vector_impl_data *)(ppEVar12 + -1))->_M_start;
        *(undefined8 *)((long)__result + lVar8) = ppEVar12[-2];
        ((undefined8 *)((long)__result + lVar8))[1] = pEVar3;
        pEVar3 = ppEVar12[1];
        puVar1 = (undefined8 *)((long)__result + lVar8 + 0x10);
        *puVar1 = *ppEVar12;
        puVar1[1] = pEVar3;
        ((_Vector_impl_data *)(ppEVar12 + -1))->_M_start = (pointer)0x0;
        *ppEVar12 = (pointer)0x0;
        ppEVar12[1] = (pointer)0x0;
        pEVar6 = std::
                 vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ::_S_relocate((pointer)local_88,(pointer)expr,(pointer)__result,p_Var7);
        __args = extraout_RDX;
        if (pEVar10 != (Expr *)0x0) {
          operator_delete(pEVar10);
          __args = extraout_RDX_00;
        }
        tree.children.
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             (pointer)(&__result->_vptr_Expr + (long)local_80 * 4);
        tree.expr = __result;
      }
      else {
        pEVar3 = ((_Vector_impl_data *)(ppEVar12 + -1))->_M_start;
        (tree.children.
         super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         ._M_impl.super__Vector_impl_data._M_start)->expr = (Expr *)ppEVar12[-2];
        ((tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start)->children).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_start = pEVar3;
        pEVar3 = ppEVar12[1];
        ((tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start)->children).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_finish = *ppEVar12;
        ((tree.children.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start)->children).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar3;
        ((_Vector_impl_data *)(ppEVar12 + -1))->_M_start = (pointer)0x0;
        *ppEVar12 = (pointer)0x0;
        ppEVar12[1] = (pointer)0x0;
        expr = pEVar10;
        pEVar6 = tree.children.
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      tree.children.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = pEVar6 + 1;
      lVar11 = lVar11 + -1;
      ppEVar12 = ppEVar12 + 4;
      pEVar10 = expr;
    } while (1 < lVar11);
    pEVar6 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((Index)tree.children.
               super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      pEVar9 = pEVar4;
      if (((long)pEVar6 - (long)pEVar4 != 0) &&
         (lVar11 = (long)pEVar6 - (long)pEVar4 >> 5, pEVar9 = pEVar6, 0 < lVar11)) {
        uVar2 = lVar11 + 1;
        lVar11 = -local_70;
        ppEVar12 = &(pEVar4->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        do {
          local_a8.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               *(pointer *)((long)ppEVar12 + lVar11 + 8);
          pEVar3 = ((_Vector_impl_data *)(ppEVar12 + -1))->_M_start;
          puVar1 = (undefined8 *)((long)ppEVar12 + lVar11 + -8);
          local_a8.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
          local_a8.
          super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
          puVar1 = (undefined8 *)((long)ppEVar12 + lVar11 + -0x10);
          *puVar1 = ppEVar12[-2];
          puVar1[1] = pEVar3;
          pEVar3 = ppEVar12[1];
          *(undefined8 *)((long)ppEVar12 + lVar11) = *ppEVar12;
          ((undefined8 *)((long)ppEVar12 + lVar11))[1] = pEVar3;
          ((_Vector_impl_data *)(ppEVar12 + -1))->_M_start = (pointer)0x0;
          *ppEVar12 = (pointer)0x0;
          ppEVar12[1] = (pointer)0x0;
          std::
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ::~vector(&local_a8);
          uVar2 = uVar2 - 1;
          ppEVar12 = ppEVar12 + 4;
        } while (1 < uVar2);
        pEVar6 = (this->expr_tree_stack_).
                 super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pEVar9 = pEVar6;
      }
      pEVar15 = (pointer)((long)local_78 + ((long)pEVar9 - (long)pEVar4));
      __args = pEVar4;
      pEVar4 = pEVar15;
      if (pEVar9 != pEVar15) {
        do {
          std::
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          ::~vector(&pEVar4->children);
          pEVar4 = pEVar4 + 1;
        } while (pEVar4 != pEVar9);
        (this->expr_tree_stack_).
        super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar15;
        __args = extraout_RDX_01;
        pEVar6 = pEVar15;
      }
    }
  }
  if (pEVar6 == (this->expr_tree_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    pEVar4 = (this->expr_tree_stack_).
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar11 = (long)pEVar6 - (long)pEVar4;
    if (lVar11 == 0x7fffffffffffffe0) {
LAB_00f680ed:
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = lVar11 >> 5;
    uVar2 = 1;
    if (pEVar6 != pEVar4) {
      uVar2 = uVar5;
    }
    p_Var13 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
               *)(uVar2 + uVar5);
    if ((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
         *)0x3fffffffffffffe < p_Var13) {
      p_Var13 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 *)0x3ffffffffffffff;
    }
    p_Var7 = (_Tp_alloc_type *)(uVar2 + uVar5);
    if (CARRY8(uVar2,uVar5)) {
      p_Var13 = (_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                 *)0x3ffffffffffffff;
    }
    pEVar3 = std::
             _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_M_allocate(p_Var13,(size_t)expr);
    std::allocator_traits<std::allocator<wabt::(anonymous_namespace)::ExprTree>>::
    construct<wabt::(anonymous_namespace)::ExprTree,wabt::(anonymous_namespace)::ExprTree&>
              ((allocator_type *)(lVar11 + (long)pEVar3),(ExprTree *)local_68,__args_00);
    pEVar6 = std::
             vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ::_S_relocate(pEVar4,pEVar6,pEVar3,p_Var7);
    IVar14 = tree.children.
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    if (pEVar4 != (pointer)0x0) {
      operator_delete(pEVar4);
    }
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_start = pEVar3;
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_finish = pEVar6 + 1;
    (this->expr_tree_stack_).
    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pEVar3 + (long)p_Var13;
  }
  else {
    std::allocator_traits<std::allocator<wabt::(anonymous_namespace)::ExprTree>>::
    construct<wabt::(anonymous_namespace)::ExprTree,wabt::(anonymous_namespace)::ExprTree&>
              ((allocator_type *)pEVar6,(ExprTree *)local_68,__args);
    ppEVar12 = &(this->expr_tree_stack_).
                super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar12 = *ppEVar12 + 1;
    IVar14 = tree.children.
             super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  if (IVar14 == 0) {
    FlushExprTreeStack(this);
  }
  std::
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  ::~vector((vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
             *)&tree);
  return;
}

Assistant:

void WatWriter::PushExpr(const Expr* expr,
                         Index operand_count,
                         Index result_count) {
  WABT_TRACE_ARGS(PushExpr, "%s, %" PRIindex ", %" PRIindex "",
                  GetExprTypeName(*expr), operand_count, result_count);
  if (operand_count <= expr_tree_stack_.size()) {
    auto last_operand = expr_tree_stack_.end();
    auto first_operand = last_operand - operand_count;
    ExprTree tree(expr);
    std::move(first_operand, last_operand, std::back_inserter(tree.children));
    expr_tree_stack_.erase(first_operand, last_operand);
    expr_tree_stack_.emplace_back(tree);
    if (result_count == 0) {
      FlushExprTreeStack();
    }
  } else {
    expr_tree_stack_.emplace_back(expr);
    FlushExprTreeStack();
  }
}